

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O0

void __thiscall
gl4cts::GPUShaderFP64Test3::writeVaryingDeclarations
          (GPUShaderFP64Test3 *this,ostream *stream,shaderStage shader_stage)

{
  ostream *poVar1;
  shaderStage shader_stage_local;
  ostream *stream_local;
  GPUShaderFP64Test3 *this_local;
  
  switch(shader_stage) {
  case FRAGMENT_SHADER:
    poVar1 = std::operator<<(stream,"flat in ");
    poVar1 = std::operator<<(poVar1,"int");
    poVar1 = std::operator<<(poVar1," ");
    poVar1 = std::operator<<(poVar1,m_varying_name_gs_fs_gs_result);
    std::operator<<(poVar1,";\n");
    poVar1 = std::operator<<(stream,"flat in ");
    poVar1 = std::operator<<(poVar1,"int");
    poVar1 = std::operator<<(poVar1," ");
    poVar1 = std::operator<<(poVar1,m_varying_name_gs_fs_tcs_result);
    std::operator<<(poVar1,";\n");
    poVar1 = std::operator<<(stream,"flat in ");
    poVar1 = std::operator<<(poVar1,"int");
    poVar1 = std::operator<<(poVar1," ");
    poVar1 = std::operator<<(poVar1,m_varying_name_gs_fs_tes_result);
    std::operator<<(poVar1,";\n");
    poVar1 = std::operator<<(stream,"flat in ");
    poVar1 = std::operator<<(poVar1,"int");
    poVar1 = std::operator<<(poVar1," ");
    poVar1 = std::operator<<(poVar1,m_varying_name_gs_fs_vs_result);
    std::operator<<(poVar1,";\n");
    std::operator<<(stream,"\n");
    poVar1 = std::operator<<(stream,"layout (location = 0) out ");
    poVar1 = std::operator<<(poVar1,"int");
    poVar1 = std::operator<<(poVar1," ");
    poVar1 = std::operator<<(poVar1,m_varying_name_fs_out_fs_result);
    std::operator<<(poVar1,";\n");
    break;
  case GEOMETRY_SHADER:
    poVar1 = std::operator<<(stream,"in  ");
    poVar1 = std::operator<<(poVar1,"int");
    poVar1 = std::operator<<(poVar1," ");
    poVar1 = std::operator<<(poVar1,m_varying_name_tes_gs_tcs_result);
    std::operator<<(poVar1,"[];\n");
    poVar1 = std::operator<<(stream,"in  ");
    poVar1 = std::operator<<(poVar1,"int");
    poVar1 = std::operator<<(poVar1," ");
    poVar1 = std::operator<<(poVar1,m_varying_name_tes_gs_tes_result);
    std::operator<<(poVar1,"[];\n");
    poVar1 = std::operator<<(stream,"in  ");
    poVar1 = std::operator<<(poVar1,"int");
    poVar1 = std::operator<<(poVar1," ");
    poVar1 = std::operator<<(poVar1,m_varying_name_tes_gs_vs_result);
    std::operator<<(poVar1,"[];\n");
    std::operator<<(stream,"\n");
    poVar1 = std::operator<<(stream,"flat out ");
    poVar1 = std::operator<<(poVar1,"int");
    poVar1 = std::operator<<(poVar1," ");
    poVar1 = std::operator<<(poVar1,m_varying_name_gs_fs_gs_result);
    std::operator<<(poVar1,";\n");
    poVar1 = std::operator<<(stream,"flat out ");
    poVar1 = std::operator<<(poVar1,"int");
    poVar1 = std::operator<<(poVar1," ");
    poVar1 = std::operator<<(poVar1,m_varying_name_gs_fs_tcs_result);
    std::operator<<(poVar1,";\n");
    poVar1 = std::operator<<(stream,"flat out ");
    poVar1 = std::operator<<(poVar1,"int");
    poVar1 = std::operator<<(poVar1," ");
    poVar1 = std::operator<<(poVar1,m_varying_name_gs_fs_tes_result);
    std::operator<<(poVar1,";\n");
    poVar1 = std::operator<<(stream,"flat out ");
    poVar1 = std::operator<<(poVar1,"int");
    poVar1 = std::operator<<(poVar1," ");
    poVar1 = std::operator<<(poVar1,m_varying_name_gs_fs_vs_result);
    std::operator<<(poVar1,";\n");
    break;
  case TESS_CONTROL_SHADER:
    poVar1 = std::operator<<(stream,"in  ");
    poVar1 = std::operator<<(poVar1,"int");
    poVar1 = std::operator<<(poVar1," ");
    poVar1 = std::operator<<(poVar1,m_varying_name_vs_tcs_vs_result);
    std::operator<<(poVar1,"[];\n");
    std::operator<<(stream,"\n");
    poVar1 = std::operator<<(stream,"out ");
    poVar1 = std::operator<<(poVar1,"int");
    poVar1 = std::operator<<(poVar1," ");
    poVar1 = std::operator<<(poVar1,m_varying_name_tcs_tes_tcs_result);
    std::operator<<(poVar1,"[];\n");
    poVar1 = std::operator<<(stream,"out ");
    poVar1 = std::operator<<(poVar1,"int");
    poVar1 = std::operator<<(poVar1," ");
    poVar1 = std::operator<<(poVar1,m_varying_name_tcs_tes_vs_result);
    std::operator<<(poVar1,"[];\n");
    break;
  case TESS_EVAL_SHADER:
    poVar1 = std::operator<<(stream,"in  ");
    poVar1 = std::operator<<(poVar1,"int");
    poVar1 = std::operator<<(poVar1," ");
    poVar1 = std::operator<<(poVar1,m_varying_name_tcs_tes_tcs_result);
    std::operator<<(poVar1,"[];\n");
    poVar1 = std::operator<<(stream,"in  ");
    poVar1 = std::operator<<(poVar1,"int");
    poVar1 = std::operator<<(poVar1," ");
    poVar1 = std::operator<<(poVar1,m_varying_name_tcs_tes_vs_result);
    std::operator<<(poVar1,"[];\n");
    std::operator<<(stream,"\n");
    poVar1 = std::operator<<(stream,"out ");
    poVar1 = std::operator<<(poVar1,"int");
    poVar1 = std::operator<<(poVar1," ");
    poVar1 = std::operator<<(poVar1,m_varying_name_tes_gs_tcs_result);
    std::operator<<(poVar1,";\n");
    poVar1 = std::operator<<(stream,"out ");
    poVar1 = std::operator<<(poVar1,"int");
    poVar1 = std::operator<<(poVar1," ");
    poVar1 = std::operator<<(poVar1,m_varying_name_tes_gs_tes_result);
    std::operator<<(poVar1,";\n");
    poVar1 = std::operator<<(stream,"out ");
    poVar1 = std::operator<<(poVar1,"int");
    poVar1 = std::operator<<(poVar1," ");
    poVar1 = std::operator<<(poVar1,m_varying_name_tes_gs_vs_result);
    std::operator<<(poVar1,";\n");
    break;
  case VERTEX_SHADER:
    poVar1 = std::operator<<(stream,"out ");
    poVar1 = std::operator<<(poVar1,"int");
    poVar1 = std::operator<<(poVar1," ");
    poVar1 = std::operator<<(poVar1,m_varying_name_vs_tcs_vs_result);
    std::operator<<(poVar1,";\n");
  }
  std::operator<<(stream,"\n");
  return;
}

Assistant:

void GPUShaderFP64Test3::writeVaryingDeclarations(std::ostream& stream, shaderStage shader_stage) const
{
	static const glw::GLchar* const varying_type = "int";

	switch (shader_stage)
	{
	case FRAGMENT_SHADER:

		/* In */
		stream << "flat in " << varying_type << " " << m_varying_name_gs_fs_gs_result << ";\n";
		stream << "flat in " << varying_type << " " << m_varying_name_gs_fs_tcs_result << ";\n";
		stream << "flat in " << varying_type << " " << m_varying_name_gs_fs_tes_result << ";\n";
		stream << "flat in " << varying_type << " " << m_varying_name_gs_fs_vs_result << ";\n";

		stream << "\n";

		/* Out */
		stream << "layout (location = 0) out " << varying_type << " " << m_varying_name_fs_out_fs_result << ";\n";

		break;

	case GEOMETRY_SHADER:

		/* In */
		stream << "in  " << varying_type << " " << m_varying_name_tes_gs_tcs_result << "[];\n";
		stream << "in  " << varying_type << " " << m_varying_name_tes_gs_tes_result << "[];\n";
		stream << "in  " << varying_type << " " << m_varying_name_tes_gs_vs_result << "[];\n";

		stream << "\n";

		/* Out */
		stream << "flat out " << varying_type << " " << m_varying_name_gs_fs_gs_result << ";\n";
		stream << "flat out " << varying_type << " " << m_varying_name_gs_fs_tcs_result << ";\n";
		stream << "flat out " << varying_type << " " << m_varying_name_gs_fs_tes_result << ";\n";
		stream << "flat out " << varying_type << " " << m_varying_name_gs_fs_vs_result << ";\n";

		break;

	case TESS_CONTROL_SHADER:

		/* In */
		stream << "in  " << varying_type << " " << m_varying_name_vs_tcs_vs_result << "[];\n";

		stream << "\n";

		/* Out */
		stream << "out " << varying_type << " " << m_varying_name_tcs_tes_tcs_result << "[];\n";
		stream << "out " << varying_type << " " << m_varying_name_tcs_tes_vs_result << "[];\n";

		break;

	case TESS_EVAL_SHADER:

		/* In */
		stream << "in  " << varying_type << " " << m_varying_name_tcs_tes_tcs_result << "[];\n";
		stream << "in  " << varying_type << " " << m_varying_name_tcs_tes_vs_result << "[];\n";

		stream << "\n";

		/* Out */
		stream << "out " << varying_type << " " << m_varying_name_tes_gs_tcs_result << ";\n";
		stream << "out " << varying_type << " " << m_varying_name_tes_gs_tes_result << ";\n";
		stream << "out " << varying_type << " " << m_varying_name_tes_gs_vs_result << ";\n";

		break;

	case VERTEX_SHADER:

		/* Out */
		stream << "out " << varying_type << " " << m_varying_name_vs_tcs_vs_result << ";\n";

		break;
	}

	stream << "\n";
}